

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push.cpp
# Opt level: O1

void __thiscall
zmq::push_t::xattach_pipe(push_t *this,pipe_t *pipe_,bool subscribe_to_all_,bool locally_initiated_)

{
  pipe_t::set_nodelay(pipe_);
  lb_t::attach(&this->_lb,pipe_);
  return;
}

Assistant:

void zmq::push_t::xattach_pipe (pipe_t *pipe_,
                                bool subscribe_to_all_,
                                bool locally_initiated_)
{
    LIBZMQ_UNUSED (subscribe_to_all_);
    LIBZMQ_UNUSED (locally_initiated_);

    //  Don't delay pipe termination as there is no one
    //  to receive the delimiter.
    pipe_->set_nodelay ();

    zmq_assert (pipe_);
    _lb.attach (pipe_);
}